

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

LIBSSH2_SFTP * libssh2_sftp_init(LIBSSH2_SESSION *session)

{
  uint32_t *out;
  uchar *puVar1;
  libssh2_nonblocking_states lVar2;
  int iVar3;
  uint32_t uVar4;
  time_t start_time;
  LIBSSH2_CHANNEL *pLVar5;
  LIBSSH2_SFTP *sftp;
  ssize_t sVar6;
  size_t sVar7;
  char *pcVar9;
  uchar *buf_00;
  LIBSSH2_SFTP **ppLVar10;
  uchar *data;
  size_t data_len;
  string_buf buf;
  size_t extname_len;
  uchar *extdata;
  uchar *extname;
  uchar *local_90;
  LIBSSH2_SFTP **local_88;
  uchar *local_80;
  size_t local_78;
  size_t local_70;
  string_buf local_68;
  uchar *local_50;
  size_t local_48;
  uchar *local_40;
  uchar *local_38;
  long lVar8;
  
  if (session != (LIBSSH2_SESSION *)0x0) {
    if ((session->state & 8) != 0) {
      start_time = time((time_t *)0x0);
      ppLVar10 = &session->sftpInit_sftp;
      buf_00 = session->sftpInit_buffer;
      local_50 = session->sftpInit_buffer + 5;
LAB_001239bf:
      local_70 = 0;
      lVar2 = session->sftpInit_state;
      sftp = session->sftpInit_sftp;
      switch(lVar2) {
      case libssh2_NB_state_idle:
        goto switchD_001239ed_caseD_0;
      default:
        goto switchD_001239ed_caseD_1;
      case libssh2_NB_state_created:
        goto switchD_001239ed_caseD_2;
      case libssh2_NB_state_sent:
        pLVar5 = session->sftpInit_channel;
        goto LAB_00123a52;
      case libssh2_NB_state_sent1:
        goto switchD_001239ed_caseD_4;
      case libssh2_NB_state_sent2:
        sVar7 = session->sftpInit_sent;
        goto LAB_00123b3e;
      }
    }
    _libssh2_error(session,-0x22,"session not authenticated yet");
  }
  return (LIBSSH2_SFTP *)0x0;
switchD_001239ed_caseD_0:
  if (sftp != (LIBSSH2_SFTP *)0x0) {
    __assert_fail("!session->sftpInit_sftp",
                  "/workspace/llm4binary/github/license_c_cmakelists/libssh2[P]libssh2/src/sftp.c",
                  0x324,"LIBSSH2_SFTP *sftp_init(LIBSSH2_SESSION *)");
  }
  session->sftpInit_state = libssh2_NB_state_created;
switchD_001239ed_caseD_2:
  pLVar5 = _libssh2_channel_open(session,"session",7,0x200000,0x8000,(uchar *)0x0,0);
  session->sftpInit_channel = pLVar5;
  if (pLVar5 != (LIBSSH2_CHANNEL *)0x0) {
    session->sftpInit_state = libssh2_NB_state_sent;
LAB_00123a52:
    iVar3 = _libssh2_channel_process_startup(pLVar5,"subsystem",9,"sftp",4);
    if (iVar3 != 0) {
      if (iVar3 != -0x25) {
        iVar3 = -0x15;
        pcVar9 = "Unable to request SFTP subsystem";
        goto LAB_00123d57;
      }
      pcVar9 = "Would block to request SFTP subsystem";
LAB_00123c7b:
      _libssh2_error(session,-0x25,pcVar9);
      goto LAB_00123d66;
    }
    session->sftpInit_state = libssh2_NB_state_sent1;
switchD_001239ed_caseD_4:
    iVar3 = _libssh2_channel_extended_data(session->sftpInit_channel,1);
    if (iVar3 == -0x25) {
      pcVar9 = "Would block requesting handle extended data";
      goto LAB_00123c7b;
    }
    sftp = (LIBSSH2_SFTP *)_libssh2_calloc(session,0x180);
    session->sftpInit_sftp = sftp;
    if (sftp == (LIBSSH2_SFTP *)0x0) {
      iVar3 = -6;
      pcVar9 = "Unable to allocate a new SFTP structure";
      goto LAB_00123d57;
    }
    sftp->channel = session->sftpInit_channel;
    sftp->request_id = 0;
    _libssh2_htonu32(buf_00,5);
    session->sftpInit_buffer[4] = '\x01';
    _libssh2_htonu32(local_50,3);
    session->sftpInit_sent = 0;
    session->sftpInit_state = libssh2_NB_state_sent2;
    sVar7 = 0;
LAB_00123b3e:
    sVar6 = _libssh2_channel_write(session->sftpInit_channel,0,buf_00 + sVar7,9 - sVar7);
    if (sVar6 == -0x25) {
      pcVar9 = "Would block sending SSH_FXP_INIT";
      goto LAB_00123c7b;
    }
    if (sVar6 < 0) {
      iVar3 = -7;
      pcVar9 = "Unable to send SSH_FXP_INIT";
LAB_00123d57:
      _libssh2_error(session,iVar3,pcVar9);
    }
    else {
      sVar7 = sVar6 + session->sftpInit_sent;
      session->sftpInit_sent = sVar7;
      if (sVar7 == 9) {
        session->sftpInit_state = libssh2_NB_state_sent3;
      }
      else {
        lVar2 = session->sftpInit_state;
switchD_001239ed_caseD_1:
        if (lVar2 == libssh2_NB_state_error_closing) {
          iVar3 = _libssh2_channel_free(session->sftpInit_channel);
          if (iVar3 != -0x25) {
            session->sftpInit_channel = (LIBSSH2_CHANNEL *)0x0;
            if (session->sftpInit_sftp != (LIBSSH2_SFTP *)0x0) {
              (*session->free)(session->sftpInit_sftp,&session->abstract);
              session->sftpInit_sftp = (LIBSSH2_SFTP *)0x0;
            }
            goto LAB_00123cad;
          }
          pcVar9 = "Would block closing channel";
          goto LAB_00123c7b;
        }
      }
      iVar3 = sftp_packet_require(sftp,'\x02',0,&local_90,&local_70,5);
      sVar7 = local_70;
      puVar1 = local_90;
      if (iVar3 == -0x26) {
        if (local_70 != 0) {
          (*session->free)(local_90,&session->abstract);
        }
        iVar3 = -0x1f;
        pcVar9 = "Invalid SSH_FXP_VERSION response";
        goto LAB_00123d57;
      }
      if (iVar3 != 0) {
        if (iVar3 == -0x25) {
          pcVar9 = "Would block receiving SSH_FXP_VERSION";
          goto LAB_00123c7b;
        }
        pcVar9 = "Timeout waiting for response from SFTP subsystem";
        goto LAB_00123d57;
      }
      local_68.data = local_90;
      local_68.dataptr = local_90 + 1;
      local_68.len = local_70;
      out = &sftp->version;
      local_88 = ppLVar10;
      local_80 = buf_00;
      iVar3 = _libssh2_get_u32(&local_68,out);
      if (iVar3 == 0) {
        if (3 < *out) {
          *out = 3;
        }
joined_r0x00123db8:
        if (puVar1 + sVar7 <= local_68.dataptr) {
          (*session->free)(local_90,&session->abstract);
          pLVar5 = sftp->channel;
          pLVar5->abstract = sftp;
          pLVar5->close_cb = libssh2_sftp_dtor;
          session->sftpInit_state = libssh2_NB_state_idle;
          *local_88 = (LIBSSH2_SFTP *)0x0;
          local_88[1] = (LIBSSH2_SFTP *)0x0;
          _libssh2_list_init(&sftp->sftp_handles);
          return sftp;
        }
        iVar3 = _libssh2_get_string(&local_68,&local_38,&local_48);
        if (iVar3 != 0) {
          (*session->free)(local_90,&session->abstract);
          _libssh2_error(session,-0x26,"Data too short when extracting extname");
          buf_00 = local_80;
          ppLVar10 = local_88;
          goto LAB_00123d5c;
        }
        iVar3 = _libssh2_get_string(&local_68,&local_40,&local_78);
        buf_00 = local_80;
        if (iVar3 != 0) {
          (*session->free)(local_90,&session->abstract);
          _libssh2_error(session,-0x26,"Data too short when extracting extdata");
          ppLVar10 = local_88;
          goto LAB_00123d5c;
        }
        if (local_78 == 0) {
          uVar4 = 0;
        }
        else {
          pcVar9 = (char *)(*session->alloc)(local_78 + 1,&session->abstract);
          if (pcVar9 == (char *)0x0) goto LAB_00123ee1;
          memcpy(pcVar9,local_40,local_78);
          pcVar9[local_78] = '\0';
          lVar8 = strtol(pcVar9,(char **)0x0,10);
          uVar4 = (uint32_t)lVar8;
          (*session->free)(pcVar9,&session->abstract);
        }
        if ((local_48 == 0x18) &&
           (iVar3 = strncmp("posix-rename@openssh.com",(char *)local_38,0x18), iVar3 == 0)) {
          sftp->posix_rename_version = uVar4;
        }
        goto joined_r0x00123db8;
      }
      (*session->free)(local_90,&session->abstract);
      _libssh2_error(session,-0x26,"Data too short when extracting version");
      buf_00 = local_80;
      ppLVar10 = local_88;
    }
    goto LAB_00123d5c;
  }
  iVar3 = libssh2_session_last_errno(session);
  if (iVar3 == -0x25) {
    pcVar9 = "Would block starting up channel";
    goto LAB_00123c7b;
  }
  _libssh2_error(session,-0x15,"Unable to startup channel");
LAB_00123cad:
  session->sftpInit_state = libssh2_NB_state_idle;
  goto LAB_00123d66;
LAB_00123ee1:
  _libssh2_error(session,-6,"Unable to allocate memory for SSH_FXP_VERSION packet");
  ppLVar10 = local_88;
LAB_00123d5c:
  session->sftpInit_state = libssh2_NB_state_error_closing;
LAB_00123d66:
  if (session->api_block_mode == 0) {
    return (LIBSSH2_SFTP *)0x0;
  }
  iVar3 = libssh2_session_last_errno(session);
  if (iVar3 != -0x25) {
    return (LIBSSH2_SFTP *)0x0;
  }
  iVar3 = _libssh2_wait_socket(session,start_time);
  if (iVar3 != 0) {
    return (LIBSSH2_SFTP *)0x0;
  }
  goto LAB_001239bf;
}

Assistant:

LIBSSH2_API LIBSSH2_SFTP *libssh2_sftp_init(LIBSSH2_SESSION *session)
{
    LIBSSH2_SFTP *ptr;

    if(!session)
        return NULL;

    if(!(session->state & LIBSSH2_STATE_AUTHENTICATED)) {
        _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                       "session not authenticated yet");
        return NULL;
    }

    BLOCK_ADJUST_ERRNO(ptr, session, sftp_init(session));
    return ptr;
}